

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void ptls_log__do_push_element_bool(char *prefix,size_t prefix_len,int v)

{
  int iVar1;
  undefined4 *puVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  iVar1 = expand_logbuf_or_invalidate(prefix,prefix_len,5);
  if (iVar1 != 0) {
    puVar2 = (undefined4 *)(*(long *)(in_FS_OFFSET + -200) + *(long *)(in_FS_OFFSET + -0xb8));
    if (v == 0) {
      *(undefined1 *)(puVar2 + 1) = 0x65;
      *puVar2 = 0x736c6166;
      lVar3 = 5;
    }
    else {
      *puVar2 = 0x65757274;
      lVar3 = 4;
    }
    *(long *)(in_FS_OFFSET + -0xb8) = *(long *)(in_FS_OFFSET + -0xb8) + lVar3;
  }
  return;
}

Assistant:

void ptls_log__do_push_element_bool(const char *prefix, size_t prefix_len, int v)
{
    if (expand_logbuf_or_invalidate(prefix, prefix_len, 5)) {
        if (v) {
            memcpy(logbuf.buf.base + logbuf.buf.off, "true", 4);
            logbuf.buf.off += 4;
        } else {
            memcpy(logbuf.buf.base + logbuf.buf.off, "false", 5);
            logbuf.buf.off += 5;
        }
    }
}